

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

void __thiscall
cs_impl::runtime_cs_ext::async_callable::async_callable
          (async_callable *this,var *fn,vector *data,array *append_args)

{
  iterator this_00;
  async_callable *in_RDX;
  callable *in_RDI;
  callable *in_stack_ffffffffffffff38;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_ffffffffffffffc0;
  _Deque_iterator<cs_impl::any,_const_cs_impl::any_&,_const_cs_impl::any_*>
  *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffd8;
  
  any::const_val<cs::callable>((any *)in_stack_ffffffffffffffc0);
  cs::callable::callable(in_RDI,in_stack_ffffffffffffff38);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::vector
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDI,
             (vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff38);
  this_00 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::end
                      ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                       in_stack_ffffffffffffff38);
  __gnu_cxx::
  __normal_iterator<cs_impl::any_const*,std::vector<cs_impl::any,std::allocator<cs_impl::any>>>::
  __normal_iterator<cs_impl::any*>
            ((__normal_iterator<const_cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
              *)in_RDI,
             (__normal_iterator<cs_impl::any_*,_std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>_>
              *)in_stack_ffffffffffffff38);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::begin
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff38);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::end
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_stack_ffffffffffffff38);
  std::vector<cs_impl::any,std::allocator<cs_impl::any>>::
  insert<std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>,void>
            ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)this_00._M_current,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  detach_args(in_RDX);
  return;
}

Assistant:

async_callable(const var &fn, vector data, const array &append_args) : func(fn.const_val<callable>()), args(std::move(data))
			{
				args.insert(args.end(), append_args.begin(), append_args.end());
				detach_args();
			}